

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mgm.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  EVP_CIPHER *pEVar2;
  EVP_CIPHER *pEVar3;
  char *name_00;
  char *name;
  EVP_CIPHER *ciph;
  EVP_CIPHER *ciph_prov;
  EVP_CIPHER *ciph_eng;
  int small;
  testcase *t;
  int ret;
  EVP_CIPHER *local_58;
  int local_2c;
  testcase *local_28;
  uint local_20;
  
  local_20 = 0;
  OPENSSL_init_crypto(0x4c,0);
  local_28 = testcases;
  while( true ) {
    if (local_28->sn == (char *)0x0) {
      if (local_20 == 0) {
        printf("All tests passed!\n");
      }
      else {
        printf("Some tests FAILED!\n");
      }
      return local_20;
    }
    pEVar2 = EVP_get_cipherbyname(local_28->sn);
    pEVar3 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,local_28->sn);
    local_58 = pEVar3;
    if (pEVar2 != (EVP_CIPHER *)0x0) {
      local_58 = pEVar2;
    }
    if (local_58 == (EVP_CIPHER *)0x0) break;
    name_00 = (char *)EVP_CIPHER_get0_name(local_58);
    printf("Tests for %s\n",name_00);
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      uVar1 = test_block((EVP_CIPHER *)local_58,name_00,local_28->nonce,local_28->nonce_len,
                         local_28->aad,local_28->aad_len,local_28->plaintext,local_28->ptext_len,
                         local_28->expected,local_28->expected_tag,local_28->key,local_2c);
      local_20 = uVar1 | local_20;
    }
    EVP_CIPHER_free(pEVar3);
    local_28 = local_28 + 1;
  }
  printf("failed to load %s\n",local_28->sn);
  return 1;
}

Assistant:

int main(void)
{
    int ret = 0;
    const struct testcase *t;

    OPENSSL_add_all_algorithms_conf();

    for (t = testcases; t->sn; t++) {
        int small;
        const EVP_CIPHER *ciph_eng = EVP_get_cipherbyname(t->sn);
        EVP_CIPHER *ciph_prov = EVP_CIPHER_fetch(NULL, t->sn, NULL);
        const EVP_CIPHER *ciph = ciph_eng ? ciph_eng : ciph_prov;
        const char *name;
        if (!ciph) {
            printf("failed to load %s\n", t->sn);
            return 1;
        }
        name = EVP_CIPHER_name(ciph);

        printf("Tests for %s\n", name);
        for (small = 0; small <= 1; small++)
            ret |= test_block(ciph, name, t->nonce, t->nonce_len,
                              t->aad, t->aad_len, t->plaintext, t->ptext_len,
                              t->expected, t->expected_tag, t->key, small);
        EVP_CIPHER_free(ciph_prov);
    }

    if (ret) {
        printf("Some tests FAILED!\n");
    } else {
        printf("All tests passed!\n");
    }
    return ret;
}